

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall Catch::Capturer::~Capturer(Capturer *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  iVar1 = std::uncaught_exceptions();
  if ((iVar1 < 1) && (this->m_captured != 0)) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      (*this->m_resultCapture->_vptr_IResultCapture[7])
                (this->m_resultCapture,
                 (long)&(((this->m_messages).
                          super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start)->macroName).m_start + lVar2);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x48;
    } while (uVar3 < this->m_captured);
  }
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->m_messages);
  return;
}

Assistant:

Capturer::~Capturer() {
        if ( !uncaught_exceptions() ){
            assert( m_captured == m_messages.size() );
            for( size_t i = 0; i < m_captured; ++i  )
                m_resultCapture.popScopedMessage( m_messages[i] );
        }
    }